

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::ReferenceObjectByHandle
          (CSharedMemoryObjectManager *this,CPalThread *pthr,HANDLE hHandleToReference,
          CAllowedObjectTypes *paot,DWORD dwRightsRequired,IPalObject **ppobj)

{
  IPalObject *local_48;
  IPalObject *pobj;
  DWORD dwRightsGranted;
  PAL_ERROR palError;
  IPalObject **ppobj_local;
  CAllowedObjectTypes *pCStack_28;
  DWORD dwRightsRequired_local;
  CAllowedObjectTypes *paot_local;
  HANDLE hHandleToReference_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  
  _dwRightsGranted = ppobj;
  ppobj_local._4_4_ = dwRightsRequired;
  pCStack_28 = paot;
  paot_local = (CAllowedObjectTypes *)hHandleToReference;
  hHandleToReference_local = pthr;
  pthr_local = (CPalThread *)this;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceObjectByHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x34e);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (pCStack_28 == (CAllowedObjectTypes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceObjectByHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x34f);
    fprintf(_stderr,"Expression: NULL != paot\n");
  }
  if (_dwRightsGranted == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","ReferenceObjectByHandle",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x350);
    fprintf(_stderr,"Expression: NULL != ppobj\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  pobj._4_4_ = CSimpleHandleManager::GetObjectFromHandle
                         (&this->m_HandleManager,(CPalThread *)hHandleToReference_local,paot_local,
                          (DWORD *)&pobj,&local_48);
  if (pobj._4_4_ == 0) {
    pobj._4_4_ = CheckObjectTypeAndRights(local_48,pCStack_28,(DWORD)pobj,ppobj_local._4_4_);
    if (pobj._4_4_ == 0) {
      *_dwRightsGranted = local_48;
    }
    else {
      (*local_48->_vptr_IPalObject[8])(local_48,hHandleToReference_local);
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pobj._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::ReferenceObjectByHandle(
    CPalThread *pthr,
    HANDLE hHandleToReference,
    CAllowedObjectTypes *paot,
    DWORD dwRightsRequired,
    IPalObject **ppobj               // OUT
    )
{
    PAL_ERROR palError;
    DWORD dwRightsGranted;
    IPalObject *pobj;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != paot);
    _ASSERTE(NULL != ppobj);

    ENTRY("CSharedMemoryObjectManager::ReferenceObjectByHandle "
        "(this=%p, pthr=%p, hHandleToReference=%p, paot=%p, "
        "dwRightsRequired=%d, ppobj=%p)\n",
        this,
        pthr,
        hHandleToReference,
        paot,
        dwRightsRequired,
        ppobj
        );

    palError = m_HandleManager.GetObjectFromHandle(
        pthr,
        hHandleToReference,
        &dwRightsGranted,
        &pobj
        );

    if (NO_ERROR == palError)
    {
        palError = CheckObjectTypeAndRights(
            pobj,
            paot,
            dwRightsGranted,
            dwRightsRequired
            );

        if (NO_ERROR == palError)
        {
            //
            // Transfer object reference to out parameter
            //

            *ppobj = pobj;
        }
        else
        {
            pobj->ReleaseReference(pthr);
        }
    }

    LOGEXIT("CSharedMemoryObjectManager::ReferenceObjectByHandle returns %d\n",
        palError
        );

    return palError;    
}